

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fctcl_t * fctcl_new2(fctcl_init_t *clo_init)

{
  bool bVar1;
  char *pcVar2;
  fctcl_t *pfStack_20;
  int ok;
  fctcl_t *clone;
  fctcl_init_t *clo_init_local;
  
  pfStack_20 = (fctcl_t *)calloc(1,0x28);
  if (pfStack_20 == (fctcl_t *)0x0) {
    return (fctcl_t *)0x0;
  }
  pfStack_20->action = clo_init->action;
  if (clo_init->help == (char *)0x0) {
    pfStack_20->help = (char *)0x0;
  }
  else {
    pcVar2 = fctstr_clone(clo_init->help);
    pfStack_20->help = pcVar2;
    if (pfStack_20->help == (char *)0x0) {
      bVar1 = false;
      goto LAB_0010766a;
    }
  }
  if (clo_init->long_opt == (char *)0x0) {
    pfStack_20->long_opt = (char *)0x0;
  }
  else {
    pcVar2 = fctstr_clone(clo_init->long_opt);
    pfStack_20->long_opt = pcVar2;
    if (pfStack_20->long_opt == (char *)0x0) {
      bVar1 = false;
      goto LAB_0010766a;
    }
  }
  if (clo_init->short_opt == (char *)0x0) {
    pfStack_20->short_opt = (char *)0x0;
  }
  else {
    pcVar2 = fctstr_clone(clo_init->short_opt);
    pfStack_20->short_opt = pcVar2;
    if (pfStack_20->short_opt == (char *)0x0) {
      bVar1 = false;
      goto LAB_0010766a;
    }
  }
  bVar1 = true;
LAB_0010766a:
  if (!bVar1) {
    fctcl__del(pfStack_20);
    pfStack_20 = (fctcl_t *)0x0;
  }
  return pfStack_20;
}

Assistant:

static fctcl_t*
fctcl_new2(fctcl_init_t const *clo_init)
{
    fctcl_t *clone = NULL;
    int ok =0;
    clone = fctcl_new();
    if ( clone == NULL )
    {
        return NULL;
    }
    clone->action = clo_init->action;
    if ( clo_init->help == NULL )
    {
        clone->help = NULL;
    }
    else
    {
        clone->help = fctstr_clone(clo_init->help);
        if ( clone->help == NULL )
        {
            ok =0;
            goto finally;
        }
    }
    if ( clo_init->long_opt == NULL )
    {
        clone->long_opt = NULL;
    }
    else
    {
        clone->long_opt = fctstr_clone(clo_init->long_opt);
        if ( clone->long_opt == NULL )
        {
            ok = 0;
            goto finally;
        }
    }
    if ( clo_init->short_opt == NULL )
    {
        clone->short_opt = NULL;
    }
    else
    {
        clone->short_opt = fctstr_clone(clo_init->short_opt);
        if ( clone->short_opt == NULL )
        {
            ok =0;
            goto finally;
        }
    }
    ok = 1;
finally:
    if ( !ok )
    {
        fctcl__del(clone);
        clone = NULL;
    }
    return clone;
}